

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_writer.cpp
# Opt level: O0

ssize_t __thiscall
Json::StyledStreamWriter::write(StyledStreamWriter *this,int __fd,void *__buf,size_t __n)

{
  undefined4 in_register_00000034;
  Value *root_local;
  ostream *out_local;
  StyledStreamWriter *this_local;
  
  this->document_ = (ostream *)CONCAT44(in_register_00000034,__fd);
  this->addChildValues_ = false;
  std::__cxx11::string::operator=((string *)&this->indentString_,"");
  writeValue(this,(Value *)__buf);
  std::operator<<(this->document_,"\n");
  this->document_ = (ostream *)0x0;
  return (ssize_t)this;
}

Assistant:

void
StyledStreamWriter::write ( std::ostream& out, const Value& root )
{
    document_ = &out;
    addChildValues_ = false;
    indentString_ = "";
    writeValue ( root );
    *document_ << "\n";
    document_ = nullptr; // Forget the stream, for safety.
}